

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O2

int isViableStructureTerrain(int structType,Generator *g,int x,int z)

{
  undefined4 uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  double dVar6;
  double dStack_80;
  uint64_t rng;
  double local_70 [8];
  
  iVar5 = 1;
  if (0x15 < g->mc) {
    if (structType - 1U < 2) {
      iVar5 = (uint)(structType == 1) * 9 + 0xc;
      iVar2 = 0xf;
      if (structType == 1) {
        iVar2 = 0x15;
      }
    }
    else {
      if (structType != 9) {
        return 1;
      }
      dStack_80 = 5.39245972890845e-318;
      rng = chunkGenerateRnd(g->seed,x >> 4,z >> 4);
      dStack_80 = 5.39252889809887e-318;
      uVar3 = nextInt(&rng,4);
      iVar5 = 5;
      if (uVar3 < 2) {
        iVar5 = -5;
      }
      iVar2 = 5;
      if (uVar3 - 1 < 2) {
        iVar2 = -5;
      }
      x = x & 0xfffffff0U | 7;
      z = z & 0xfffffff0U | 7;
    }
    local_70[1] = (double)(iVar5 + x) * 0.25;
    local_70[0] = (double)z * 0.25;
    local_70[2] = (double)(iVar2 + z) * 0.25;
    rng = (uint64_t)((double)x * 0.25);
    local_70[3] = (double)x * 0.25;
    local_70[4] = local_70[2];
    local_70[5] = local_70[1];
    local_70[6] = (double)z * 0.25;
    uVar1 = *(undefined4 *)((long)&g->field_5 + 0x6008);
    *(undefined4 *)((long)&g->field_5 + 0x6008) = 4;
    lVar4 = 8;
    do {
      if (lVar4 + 0x10 == 0x58) {
        iVar5 = 1;
        break;
      }
      iVar5 = 0;
      dStack_80 = 5.39344291954368e-318;
      dVar6 = sampleClimatePara((BiomeNoise *)&(g->field_5).field_0,(int64_t *)0x0,
                                *(double *)((long)&dStack_80 + lVar4),
                                *(double *)((long)local_70 + lVar4 + -8));
      lVar4 = lVar4 + 0x10;
    } while (0.48 <= dVar6);
    *(undefined4 *)((long)&g->field_5 + 0x6008) = uVar1;
  }
  return iVar5;
}

Assistant:

int isViableStructureTerrain(int structType, Generator *g, int x, int z)
{
    int sx, sz;
    if (g->mc <= MC_1_17)
        return 1;
    if (structType == Desert_Pyramid || structType == Jungle_Temple)
    {
        sx = (structType == Desert_Pyramid ? 21 : 12);
        sz = (structType == Desert_Pyramid ? 21 : 15);
    }
    else if (structType == Mansion)
    {
        int cx = x >> 4, cz = z >> 4;
        uint64_t rng = chunkGenerateRnd(g->seed, cx, cz);
        int rot = nextInt(&rng, 4);
        sx = 5;
        sz = 5;
        if (rot == 0) { sx = -5; }
        if (rot == 1) { sx = -5; sz = -5; }
        if (rot == 2) { sz = -5; }
        x = cx * 16 + 7;
        z = cz * 16 + 7;
    }
    else
    {
        return 1;
    }

    // approx surface height using depth parameter (0.5 ~ sea level)
    double corners[][2] = {
        {(x+ 0)/4.0, (z+ 0)/4.0},
        {(x+sx)/4.0, (z+sz)/4.0},
        {(x+ 0)/4.0, (z+sz)/4.0},
        {(x+sx)/4.0, (z+ 0)/4.0},
    };
    int nptype = g->bn.nptype;
    int i, ret = 1;
    g->bn.nptype = NP_DEPTH;
    for (i = 0; i < 4; i++)
    {
        double depth = sampleClimatePara(&g->bn, 0, corners[i][0], corners[i][1]);
        if (depth < 0.48)
        {
            ret = 0;
            break;
        }
    }
    g->bn.nptype = nptype;
    return ret;
}